

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O0

pair<switches,_int> *
get_switches(pair<switches,_int> *__return_storage_ptr__,int argc,tchar **argv)

{
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  revision_opt *prVar3;
  int local_98;
  uint local_94;
  maybe<unsigned_int,_void> local_90;
  undefined1 local_88 [8];
  switches result;
  allocator local_41;
  string local_40 [32];
  tchar **local_20;
  tchar **argv_local;
  pair<switches,_int> *ppStack_10;
  int argc_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  ppStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"pstore diff utility\n",&local_41);
  pstore::command_line::parse_command_line_options(argc,argv,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  switches::switches((switches *)local_88);
  pbVar2 = pstore::command_line::
           opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           ::get((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                  *)(anonymous_namespace)::db_path_abi_cxx11_);
  std::__cxx11::string::operator=((string *)local_88,(string *)pbVar2);
  prVar3 = pstore::command_line::
           opt<pstore::command_line::revision_opt,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           ::get((opt<pstore::command_line::revision_opt,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                  *)(anonymous_namespace)::first_revision_abi_cxx11_);
  result._24_4_ = pstore::command_line::revision_opt::operator_cast_to_unsigned_int(prVar3);
  uVar1 = pstore::command_line::option::get_num_occurrences
                    ((option *)(anonymous_namespace)::second_revision_abi_cxx11_);
  if (uVar1 == 0) {
    pstore::nothing<unsigned_int>();
  }
  else {
    prVar3 = pstore::command_line::
             opt<pstore::command_line::revision_opt,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
             ::get((opt<pstore::command_line::revision_opt,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    *)(anonymous_namespace)::second_revision_abi_cxx11_);
    local_94 = pstore::command_line::revision_opt::operator_cast_to_unsigned_int(prVar3);
    pstore::just<unsigned_int>(&local_90,&local_94);
  }
  pstore::maybe<unsigned_int,_void>::operator=
            ((maybe<unsigned_int,_void> *)&result.field_0x1c,&local_90);
  pstore::maybe<unsigned_int,_void>::~maybe(&local_90);
  result.second_revision.valid_ =
       pstore::command_line::opt<bool,_pstore::command_line::parser<bool,_void>_>::get
                 ((opt<bool,_pstore::command_line::parser<bool,_void>_> *)(anonymous_namespace)::hex
                 );
  local_98 = 0;
  std::pair<switches,_int>::pair<switches_&,_int,_true>
            (__return_storage_ptr__,(switches *)local_88,&local_98);
  switches::~switches((switches *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::pair<switches, int> get_switches (int argc, tchar * argv[]) {
    using namespace pstore;
    parse_command_line_options (argc, argv, "pstore diff utility\n");

    switches result;
    result.db_path = db_path.get ();
    result.first_revision = static_cast<unsigned> (first_revision.get ());
    result.second_revision = second_revision.get_num_occurrences () > 0
                                 ? just (static_cast<unsigned> (second_revision.get ()))
                                 : nothing<revision_number> ();
    result.hex = hex.get ();
    return {result, EXIT_SUCCESS};
}